

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,VoidCastedCallStatementSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  SubroutineKind SVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  ExpressionStatement *stmt;
  CallExpression *pCVar5;
  Type *pTVar6;
  Statement *pSVar7;
  Diagnostic *this;
  string_view arg;
  SourceRange local_30;
  Expression *args;
  
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
  iVar2 = Expression::bind((int)pEVar4,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,&local_30);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    if (args->kind == Call) {
      pCVar5 = Expression::as<slang::ast::CallExpression>(args);
      SVar3 = CallExpression::getSubroutineKind(pCVar5);
      if (SVar3 != Task) {
LAB_00233496:
        pTVar6 = not_null<const_slang::ast::Type_*>::get(&args->type);
        bVar1 = Type::isVoid(pTVar6);
        if (!bVar1) {
          return &stmt->super_Statement;
        }
        this = ASTContext::addDiag(context,(DiagCode)0x500008,args->sourceRange);
        pCVar5 = Expression::as<slang::ast::CallExpression>(args);
        arg = CallExpression::getSubroutineName(pCVar5);
        Diagnostic::operator<<(this,arg);
        return &stmt->super_Statement;
      }
      pTVar6 = not_null<const_slang::ast::Type_*>::get(&args->type);
      bVar1 = Type::isVoid(pTVar6);
      if (!bVar1) goto LAB_00233496;
    }
    ASTContext::addDiag(context,(DiagCode)0x4a0008,args->sourceRange);
  }
  pSVar7 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar7;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const VoidCastedCallStatementSyntax& syntax,
                                           const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.expr, context);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    if (expr.kind != ExpressionKind::Call ||
        (expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task &&
         expr.type->isVoid())) {
        context.addDiag(diag::VoidCastFuncCall, expr.sourceRange);
        return badStmt(compilation, result);
    }

    if (expr.type->isVoid()) {
        context.addDiag(diag::PointlessVoidCast, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
    }

    return *result;
}